

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkHaigCreateClasses(Vec_Ptr_t *vMembers)

{
  long lVar1;
  uint __line;
  Vec_Ptr_t *p;
  undefined8 *puVar2;
  void *pvVar3;
  long *plVar4;
  long *Entry;
  int iVar5;
  char *__assertion;
  ulong uVar6;
  ulong uVar7;
  
  p = Vec_PtrAlloc(0x1002);
  for (iVar5 = 0; iVar5 < vMembers->nSize; iVar5 = iVar5 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,iVar5);
    plVar4 = (long *)*puVar2;
    if (*plVar4 != 0) {
      __assertion = "pRepr->pData == NULL";
      __line = 0x54;
      goto LAB_006d216f;
    }
    if ((*(uint *)(plVar4 + 4) & 0x10) == 0) {
      *(uint *)(plVar4 + 4) = *(uint *)(plVar4 + 4) | 0x10;
      Vec_PtrPush(p,plVar4);
    }
  }
  uVar6 = (ulong)(uint)p->nSize;
  iVar5 = 0;
  if (p->nSize < 1) {
    uVar6 = 0;
    iVar5 = 0;
  }
  for (; (int)uVar6 != iVar5; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(p,iVar5);
    *(byte *)((long)pvVar3 + 0x20) = *(byte *)((long)pvVar3 + 0x20) & 0xef;
    *(void **)pvVar3 = pvVar3;
  }
  for (iVar5 = 0; iVar5 < vMembers->nSize; iVar5 = iVar5 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,iVar5);
    if (*(int *)((long)puVar2 + 0x24) < *(int *)(*(long *)*puVar2 + 0x24)) {
      *(long *)*puVar2 = (long)puVar2;
    }
  }
  iVar5 = 0;
  do {
    if (vMembers->nSize <= iVar5) {
      uVar7 = 0;
      while( true ) {
        if (uVar6 == uVar7) {
          for (iVar5 = 0; iVar5 < vMembers->nSize; iVar5 = iVar5 + 1) {
            puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,iVar5);
            if ((undefined8 *)*puVar2 == puVar2) {
              *puVar2 = 0;
            }
          }
          return p;
        }
        Entry = (long *)Vec_PtrEntry(p,(int)uVar7);
        plVar4 = (long *)*Entry;
        if ((long *)*plVar4 != plVar4) break;
        p->pArray[uVar7] = plVar4;
        Vec_PtrPush(vMembers,Entry);
        uVar7 = uVar7 + 1;
      }
      __assertion = "pRepr->pData == pRepr";
      __line = 0x77;
      goto LAB_006d216f;
    }
    plVar4 = (long *)Vec_PtrEntry(vMembers,iVar5);
    lVar1 = *(long *)*plVar4;
    *plVar4 = lVar1;
    iVar5 = iVar5 + 1;
  } while (*(int *)(lVar1 + 0x24) <= *(int *)((long)plVar4 + 0x24));
  __assertion = "((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id";
  __line = 0x70;
LAB_006d216f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                ,__line,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkHaigCreateClasses( Vec_Ptr_t * vMembers )
{
    Vec_Ptr_t * vClasses;
    Hop_Obj_t * pObj, * pRepr;
    int i;

    // count classes
    vClasses = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == NULL );
        if ( pRepr->fMarkA == 0 ) // new
        {
            pRepr->fMarkA = 1;
            Vec_PtrPush( vClasses, pRepr );
        }
    }

    // set representatives as representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->pData = pObj;
    }

    // go through the members and update
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( ((Hop_Obj_t *)pRepr->pData)->Id > pObj->Id )
            pRepr->pData = pObj;
    }

    // change representatives of the class
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        pObj->pData = pRepr->pData;
        assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
    }

    // update classes
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == pRepr );
//        pRepr->pData = NULL;
        Vec_PtrWriteEntry( vClasses, i, pRepr );
        Vec_PtrPush( vMembers, pObj );
    }

    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
        if ( pObj->pData == pObj )
            pObj->pData = NULL;

/*
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        printf( "ObjId = %4d : ", pObj->Id );
        if ( pObj->pData == NULL )
        {
            printf( "NULL" );
        }
        else
        {
            printf( "%4d", ((Hop_Obj_t *)pObj->pData)->Id );
            assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
        }
        printf( "\n" );
    }
*/
    return vClasses;
}